

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O0

ion_err_t create_overflow_bucket
                    (int bucket_idx,ion_fpos_t *overflow_loc,linear_hash_table_t *linear_hash)

{
  int iVar1;
  FILE *__s;
  void *__ptr;
  int iVar2;
  long lVar3;
  size_t sVar4;
  undefined8 uStack_60;
  void *local_58;
  int local_4c;
  long lStack_48;
  int i;
  unsigned_long __vla_expr0;
  int local_38 [2];
  linear_hash_bucket_t bucket;
  ion_err_t err;
  linear_hash_table_t *linear_hash_local;
  ion_fpos_t *overflow_loc_local;
  int bucket_idx_local;
  
  bucket.overflow_location._7_1_ = 0x12;
  local_38[1] = 0;
  uStack_60 = 0x119cf4;
  local_38[0] = bucket_idx;
  bucket._0_8_ = array_list_get(bucket_idx,linear_hash->bucket_map);
  uStack_60 = 0x119d0e;
  iVar2 = fseek((FILE *)linear_hash->database,0,2);
  if (iVar2 == 0) {
    uStack_60 = 0x119d2c;
    lVar3 = ftell((FILE *)linear_hash->database);
    *overflow_loc = lVar3;
    uStack_60 = 0x119d4d;
    bucket.overflow_location._7_1_ =
         array_list_insert(local_38[0],*overflow_loc,linear_hash->bucket_map);
    overflow_loc_local._7_1_ = bucket.overflow_location._7_1_;
    if (bucket.overflow_location._7_1_ == '\0') {
      uStack_60 = 0x119d7f;
      sVar4 = fwrite(local_38,0x10,1,(FILE *)linear_hash->database);
      if (sVar4 == 1) {
        lVar3 = (long)((linear_hash->super).record.key_size + (linear_hash->super).record.value_size
                      );
        lStack_48 = lVar3 + 4;
        lVar3 = -(lVar3 + 0x13U & 0xfffffffffffffff0);
        iVar2 = (linear_hash->super).record.key_size;
        iVar1 = (linear_hash->super).record.value_size;
        local_58 = (void *)((long)&local_58 + lVar3);
        __vla_expr0 = (unsigned_long)&local_58;
        *(undefined8 *)((long)&uStack_60 + lVar3) = 0x119de3;
        memset((void *)((long)&local_58 + lVar3),0,(long)(iVar2 + iVar1));
        for (local_4c = 0; __ptr = local_58, local_4c < linear_hash->records_per_bucket;
            local_4c = local_4c + 1) {
          iVar2 = (linear_hash->super).record.key_size;
          iVar1 = (linear_hash->super).record.value_size;
          __s = (FILE *)linear_hash->database;
          *(undefined8 *)((long)&uStack_60 + lVar3) = 0x119e21;
          sVar4 = fwrite(__ptr,(long)(iVar2 + iVar1) + 4,1,__s);
          if (sVar4 != 1) {
            return '\a';
          }
        }
        overflow_loc_local._7_1_ = '\0';
      }
      else {
        overflow_loc_local._7_1_ = '\a';
      }
    }
  }
  else {
    overflow_loc_local._7_1_ = '\r';
  }
  return overflow_loc_local._7_1_;
}

Assistant:

ion_err_t
create_overflow_bucket(
	int					bucket_idx,
	ion_fpos_t			*overflow_loc,
	linear_hash_table_t *linear_hash
) {
	ion_err_t err = err_uninitialized;

	/* initialize bucket fields */
	linear_hash_bucket_t bucket;

	bucket.idx					= bucket_idx;
	bucket.record_count			= 0;
	bucket.overflow_location	= array_list_get(bucket_idx, linear_hash->bucket_map);

	/* seek to end of file to append new bucket */
	if (0 != fseek(linear_hash->database, 0, SEEK_END)) {
		return err_file_bad_seek;
	}

	/* get overflow location for new overflow bucket */
	*overflow_loc	= ftell(linear_hash->database);

	err				= array_list_insert(bucket.idx, *overflow_loc, linear_hash->bucket_map);

	if (err != err_ok) {
		return err;
	}

	/* write to file */
	if (1 != fwrite(&bucket, sizeof(linear_hash_bucket_t), 1, linear_hash->database)) {
		return err_file_write_error;
	}

	/* write bucket data to file */
	ion_byte_t record_blank[linear_hash->super.record.key_size + linear_hash->super.record.value_size + sizeof(linear_hash_record_status_empty)];

	memset(record_blank, 0, linear_hash->super.record.key_size + linear_hash->super.record.value_size);

	int i;

	for (i = 0; i < linear_hash->records_per_bucket; i++) {
		if (1 != fwrite(record_blank, linear_hash->super.record.key_size + linear_hash->super.record.value_size + sizeof(linear_hash_record_status_empty), 1, linear_hash->database)) {
			return err_file_write_error;
		}
	}

	return err_ok;
}